

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusTypes.cpp
# Opt level: O3

string * int2str_abi_cxx11_(string *__return_storage_ptr__,U8 i)

{
  size_t sVar1;
  undefined7 in_register_00000031;
  char number_str [8];
  char acStack_18 [8];
  
  AnalyzerHelpers::GetNumberString
            (CONCAT71(in_register_00000031,i) & 0xffffffff,Decimal,8,acStack_18,8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(acStack_18);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_18,acStack_18 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string int2str( const U8 i )
{
    char number_str[ 8 ];
    AnalyzerHelpers::GetNumberString( i, Decimal, 8, number_str, sizeof( number_str ) );
    return number_str;
}